

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# visitor_ict.cpp
# Opt level: O2

void __thiscall PrintICT::visit(PrintICT *this,MOVE *node)

{
  ExprNode *pEVar1;
  
  printIR(this,"MOVE");
  this->level = this->level + 1;
  pEVar1 = node->dst;
  if (pEVar1 != (ExprNode *)0x0) {
    (*(pEVar1->super_StmNode).super_ICTNode._vptr_ICTNode[2])(pEVar1,this);
  }
  pEVar1 = node->src;
  if (pEVar1 != (ExprNode *)0x0) {
    (*(pEVar1->super_StmNode).super_ICTNode._vptr_ICTNode[2])(pEVar1,this);
  }
  this->level = this->level - 1;
  return;
}

Assistant:

void PrintICT::visit(MOVE *node) {
    printIR("MOVE");
    up_level();
    if (node->getDst() != NULL) node->getDst()->accept(this);
    if (node->getSrc() != NULL) node->getSrc()->accept(this);
    down_level();
}